

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O0

void __thiscall Application::printHelp(Application *this)

{
  ostream *poVar1;
  long in_RDI;
  EffectManager *unaff_retaddr;
  
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Keyboard actions :");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"* Escape      : Exit App");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"* H           : This help menu");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "* Right/Left  : Select next/previous joystick among the FF capable detected ones"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "* Up/Down     : Select next/previous effect for the selected joystick");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"* PgUp/PgDn   : Increase/decrease from 5% the master gain ");
  poVar1 = std::operator<<(poVar1,"for all the joysticks");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"* Space       : Toggle auto-centering on all the joysticks");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((*(byte *)(in_RDI + 0x39) & 1) != 0) {
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"Implemented effects :");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    EffectManager::printEffects(unaff_retaddr);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void printHelp()
	{
		cout << endl
			 << "Keyboard actions :" << endl
			 << "* Escape      : Exit App" << endl
			 << "* H           : This help menu" << endl
			 << "* Right/Left  : Select next/previous joystick among the FF capable detected ones" << endl
			 << "* Up/Down     : Select next/previous effect for the selected joystick" << endl
			 << "* PgUp/PgDn   : Increase/decrease from 5% the master gain "
			 << "for all the joysticks" << endl
			 << "* Space       : Toggle auto-centering on all the joysticks" << endl;
		if(_bIsInitialized)
		{
			cout << endl
				 << "Implemented effects :" << endl
				 << endl;
			_pEffectMgr->printEffects();
			cout << endl;
		}
	}